

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# properties_test.cpp
# Opt level: O1

void __thiscall
Properties_Measurements_Test::~Properties_Measurements_Test(Properties_Measurements_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Properties, Measurements) {
  Manifold cube = Manifold::Cube();
  EXPECT_FLOAT_EQ(cube.Volume(), 1.0);
  EXPECT_FLOAT_EQ(cube.SurfaceArea(), 6.0);

  cube = cube.Scale(vec3(-1.0));
  EXPECT_FLOAT_EQ(cube.Volume(), 1.0);
  EXPECT_FLOAT_EQ(cube.SurfaceArea(), 6.0);
}